

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O2

void cert_expr_builder_add(CertExprBuilder *eb,char *wildcard)

{
  size_t sVar1;
  ptrlen pVar2;
  _Bool _Var3;
  Token TVar4;
  char **ppcVar5;
  char *pcVar6;
  ptrlen pl;
  ptrlen toktext_00;
  char *err;
  ptrlen toktext;
  ptrlen local_28;
  
  pl = ptrlen_from_asciz(wildcard);
  local_28 = pl;
  TVar4 = lex(&local_28,&toktext,&err);
  pVar2.len = toktext.len;
  pVar2.ptr = toktext.ptr;
  if (TVar4 == TOK_ERROR) {
    safefree(err);
    return;
  }
  if (((TVar4 == TOK_ATOM) && (pl == pVar2)) &&
     (toktext_00.len = pl.len, toktext_00.ptr = toktext.ptr, _Var3 = atom_is_hostname_wc(toktext_00)
     , _Var3)) {
    ppcVar5 = (char **)safegrowarray(eb->wcs,&eb->wcsize,8,eb->nwcs,1,false);
    eb->wcs = ppcVar5;
    pcVar6 = mkstr(pl);
    sVar1 = eb->nwcs;
    eb->nwcs = sVar1 + 1;
    eb->wcs[sVar1] = pcVar6;
  }
  return;
}

Assistant:

void cert_expr_builder_add(CertExprBuilder *eb, const char *wildcard)
{
    /* Check this wildcard is lexically valid as an atom */
    ptrlen orig = ptrlen_from_asciz(wildcard), pl = orig;
    ptrlen toktext;
    char *err;
    Token tok = lex(&pl, &toktext, &err);
    if (!(tok == TOK_ATOM &&
          toktext.ptr == orig.ptr &&
          toktext.len == orig.len &&
          atom_is_hostname_wc(toktext))) {
        if (tok == TOK_ERROR)
            sfree(err);
        return;
    }

    sgrowarray(eb->wcs, eb->wcsize, eb->nwcs);
    eb->wcs[eb->nwcs++] = mkstr(orig);
}